

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

int __thiscall FixedSizeCache<int>::min(FixedSizeCache<int> *this)

{
  int iVar1;
  long lVar2;
  runtime_error *this_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar3;
  int *piVar4;
  int iVar5;
  
  iVar1 = this->_count;
  if ((long)iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache::min() called on empty cache");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar3 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 != 1) {
    iVar5 = *piVar3;
    lVar2 = (long)iVar1 * 4 + -4;
    piVar4 = piVar3;
    do {
      piVar4 = piVar4 + 1;
      if (*piVar4 < iVar5) {
        piVar3 = piVar4;
        iVar5 = *piVar4;
      }
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
  }
  return *piVar3;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }